

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi.c
# Opt level: O1

CURLMcode curl_multi_fdset(Curl_multi *multi,fd_set *read_fd_set,fd_set *write_fd_set,
                          fd_set *exc_fd_set,int *max_fd)

{
  int iVar1;
  CURLMcode CVar2;
  Curl_llist_node *n;
  Curl_easy *data;
  ulong uVar3;
  ulong uVar4;
  int iVar5;
  int iVar6;
  
  CVar2 = CURLM_BAD_HANDLE;
  if (((multi != (Curl_multi *)0x0) && (multi->magic == 0xbab1e)) &&
     (CVar2 = CURLM_RECURSIVE_API_CALL, (multi->field_0x279 & 4) == 0)) {
    n = Curl_llist_head(&multi->process);
    if (n == (Curl_llist_node *)0x0) {
      iVar5 = -1;
    }
    else {
      iVar5 = -1;
      do {
        data = (Curl_easy *)Curl_node_elem(n);
        multi_getsock(data,&data->last_poll);
        uVar3 = (ulong)(data->last_poll).num;
        if (uVar3 != 0) {
          uVar4 = 0;
          do {
            iVar1 = (data->last_poll).sockets[uVar4];
            if (iVar1 < 0x400) {
              if (((data->last_poll).actions[uVar4] & 1) != 0) {
                iVar6 = iVar1 + 0x3f;
                if (-1 < iVar1) {
                  iVar6 = iVar1;
                }
                read_fd_set->fds_bits[iVar6 >> 6] =
                     read_fd_set->fds_bits[iVar6 >> 6] | 1L << ((byte)iVar1 & 0x3f);
              }
              if (((data->last_poll).actions[uVar4] & 2) != 0) {
                iVar6 = iVar1 + 0x3f;
                if (-1 < iVar1) {
                  iVar6 = iVar1;
                }
                write_fd_set->fds_bits[iVar6 >> 6] =
                     write_fd_set->fds_bits[iVar6 >> 6] | 1L << ((byte)iVar1 & 0x3f);
              }
              if (iVar5 < iVar1) {
                iVar5 = iVar1;
              }
            }
            uVar4 = uVar4 + 1;
          } while (uVar3 != uVar4);
        }
        n = Curl_node_next(n);
      } while (n != (Curl_llist_node *)0x0);
    }
    *max_fd = iVar5;
    CVar2 = CURLM_OK;
  }
  return CVar2;
}

Assistant:

CURLMcode curl_multi_fdset(struct Curl_multi *multi,
                           fd_set *read_fd_set, fd_set *write_fd_set,
                           fd_set *exc_fd_set, int *max_fd)
{
  /* Scan through all the easy handles to get the file descriptors set.
     Some easy handles may not have connected to the remote host yet,
     and then we must make sure that is done. */
  int this_max_fd = -1;
  struct Curl_llist_node *e;
  (void)exc_fd_set; /* not used */

  if(!GOOD_MULTI_HANDLE(multi))
    return CURLM_BAD_HANDLE;

  if(multi->in_callback)
    return CURLM_RECURSIVE_API_CALL;

  for(e = Curl_llist_head(&multi->process); e; e = Curl_node_next(e)) {
    struct Curl_easy *data = Curl_node_elem(e);
    unsigned int i;

    multi_getsock(data, &data->last_poll);

    for(i = 0; i < data->last_poll.num; i++) {
      if(!FDSET_SOCK(data->last_poll.sockets[i]))
        /* pretend it does not exist */
        continue;
      if(data->last_poll.actions[i] & CURL_POLL_IN)
        FD_SET(data->last_poll.sockets[i], read_fd_set);
      if(data->last_poll.actions[i] & CURL_POLL_OUT)
        FD_SET(data->last_poll.sockets[i], write_fd_set);
      if((int)data->last_poll.sockets[i] > this_max_fd)
        this_max_fd = (int)data->last_poll.sockets[i];
    }
  }

  *max_fd = this_max_fd;

  return CURLM_OK;
}